

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRhiVertexInputLayout *v)

{
  QDebug *pQVar1;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QVarLengthArray<QRhiVertexInputAttribute,_8LL> *vec;
  QDebug *in_stack_ffffffffffffff98;
  QDebug *this;
  Stream *t;
  QDebug local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)(local_28 + 0x18),in_RSI);
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
  this = &local_30;
  QDebug::QDebug(this,pQVar1);
  vec = (QVarLengthArray<QRhiVertexInputAttribute,_8LL> *)local_28;
  operator<<(this,(QVarLengthArray<QRhiVertexInputBinding,_8LL> *)vec);
  pQVar1 = QDebug::operator<<(this,(char *)t);
  QDebug::QDebug((QDebug *)(local_28 + 8),pQVar1);
  pQVar1 = (QDebug *)(local_28 + 0x10);
  operator<<(this,vec);
  QDebug::operator<<(pQVar1,(char)((ulong)in_RDI >> 0x38));
  QDebug::~QDebug(pQVar1);
  QDebug::~QDebug((QDebug *)(local_28 + 8));
  QDebug::~QDebug((QDebug *)vec);
  QDebug::~QDebug(this);
  QDebug::QDebug(pQVar1,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)(local_28 + 0x18));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiVertexInputLayout &v)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiVertexInputLayout(bindings=" << v.m_bindings
                  << " attributes=" << v.m_attributes
                  << ')';
    return dbg;
}